

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

uint16_t __thiscall xray_re::xr_ogf_v3::motion_io::import_params(motion_io *this,xr_reader *r)

{
  uint8_t uVar1;
  bool bVar2;
  uint16_t uVar3;
  float fVar4;
  uint16_t motion_id;
  xr_reader *r_local;
  motion_io *this_local;
  
  xr_reader::r_sz(r,&(this->super_xr_skl_motion).super_xr_motion.m_name);
  uVar1 = xr_reader::r_u8(r);
  (this->super_xr_skl_motion).m_flags = (uint)(uVar1 == '\0');
  uVar3 = xr_reader::r_u16(r);
  (this->super_xr_skl_motion).m_bone_or_part = uVar3;
  uVar3 = xr_reader::r_u16(r);
  fVar4 = xr_reader::r_float(r);
  (this->super_xr_skl_motion).m_speed = fVar4;
  fVar4 = xr_reader::r_float(r);
  (this->super_xr_skl_motion).m_power = fVar4;
  fVar4 = xr_reader::r_float(r);
  (this->super_xr_skl_motion).m_accrue = fVar4;
  fVar4 = xr_reader::r_float(r);
  (this->super_xr_skl_motion).m_falloff = fVar4;
  bVar2 = xr_reader::r_bool(r);
  if (bVar2) {
    (this->super_xr_skl_motion).m_flags = (this->super_xr_skl_motion).m_flags | 2;
  }
  return uVar3;
}

Assistant:

inline uint16_t xr_ogf_v3::motion_io::import_params(xr_reader& r)
{
	r.r_sz(m_name);
	m_flags = (r.r_u8() == SMT_FX) ? SMF_FX : 0;
	m_bone_or_part = r.r_u16();
	uint16_t motion_id = r.r_u16();
	m_speed = r.r_float();
	m_power = r.r_float();
	m_accrue = r.r_float();
	m_falloff = r.r_float();
	if (r.r_bool())
		m_flags |= SMF_STOP_AT_END;
	return motion_id;
}